

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wif.c
# Opt level: O3

int wally_wif_to_public_key(char *wif,uint32_t prefix,uchar *bytes_out,size_t len,size_t *written)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  size_t uncompressed;
  uchar buf [38];
  uchar pub_key [33];
  long local_90;
  byte local_88;
  uchar local_87 [47];
  uchar local_58 [40];
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if (wif == (char *)0x0) {
    return -2;
  }
  bVar2 = bytes_out == (uchar *)0x0 || 0xff < prefix;
  if (bVar2) {
    return -2;
  }
  iVar1 = is_uncompressed(wif,&local_88,(size_t)&local_90,(size_t *)CONCAT71((int7)(len >> 8),bVar2)
                         );
  if ((local_88 != prefix) || (iVar1 != 0)) {
    wally_clear(&local_88,0x26);
    return -2;
  }
  uVar3 = (ulong)(local_90 != 0) * 0x20 + 0x21;
  *written = uVar3;
  if (len < uVar3) {
    wally_clear(&local_88,0x26);
    return 0;
  }
  if (local_90 == 0) {
    iVar1 = wally_ec_public_key_from_private_key(local_87,0x20,bytes_out,0x21);
LAB_004b56be:
    if (iVar1 == 0) {
      iVar1 = 0;
      goto LAB_004b56cf;
    }
  }
  else {
    iVar1 = wally_ec_public_key_from_private_key(local_87,0x20,local_58,0x21);
    if (iVar1 == 0) {
      iVar1 = wally_ec_public_key_decompress(local_58,0x21,bytes_out,0x41);
      goto LAB_004b56be;
    }
  }
  *written = 0;
LAB_004b56cf:
  wally_clear_2(&local_88,0x26,local_58,0x21);
  return iVar1;
}

Assistant:

int wally_wif_to_public_key(const char *wif,
                            uint32_t prefix,
                            unsigned char *bytes_out,
                            size_t len,
                            size_t *written)
{
    int ret;
    size_t uncompressed;
    unsigned char buf[2 + EC_PRIVATE_KEY_LEN + BASE58_CHECKSUM_LEN], pub_key[EC_PUBLIC_KEY_LEN];

    if (written)
        *written = 0;

    if (!wif || (prefix & ~0xff) || !bytes_out)
        return WALLY_EINVAL;

    ret = is_uncompressed(wif, buf, sizeof(buf), &uncompressed);

    if (buf[0] != prefix || ret) {
        wally_clear(buf, sizeof(buf));
        return WALLY_EINVAL; /** Prefix does not match or invalid format*/
    }

    *written = uncompressed ? EC_PUBLIC_KEY_UNCOMPRESSED_LEN : EC_PUBLIC_KEY_LEN;

    if (len < *written) {
        wally_clear(buf, sizeof(buf));
        return WALLY_OK; /* Not enough output space, return required size */
    }

    if (uncompressed) {
        if (!(ret = wally_ec_public_key_from_private_key(&buf[1], EC_PRIVATE_KEY_LEN, pub_key, EC_PUBLIC_KEY_LEN)))
            ret = wally_ec_public_key_decompress(pub_key, EC_PUBLIC_KEY_LEN, bytes_out, EC_PUBLIC_KEY_UNCOMPRESSED_LEN);
    } else
        ret = wally_ec_public_key_from_private_key(&buf[1], EC_PRIVATE_KEY_LEN, bytes_out, EC_PUBLIC_KEY_LEN);

    if (ret != WALLY_OK)
        *written = 0;

    wally_clear_2(buf, sizeof(buf), pub_key, sizeof(pub_key));
    return ret;
}